

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

int __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::copy
          (TypedAttribute<Imath_3_2::Matrix33<float>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  float (*pafVar1) [3];
  TypedAttribute<Imath_3_2::Matrix33<float>_> *this_00;
  
  this_00 = (TypedAttribute<Imath_3_2::Matrix33<float>_> *)operator_new(0x30);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  *(float *)((long)((this_00->_value).x + 0) + 0) = 0.0;
  *(float *)((long)((this_00->_value).x + 0) + 4) = 0.0;
  *(undefined8 *)((this_00->_value).x[0] + 2) = 0;
  pafVar1 = (this_00->_value).x;
  *(float *)((long)(pafVar1 + 1) + 4) = 0.0;
  *(float *)((long)(pafVar1 + 1) + 8) = 0.0;
  *(float *)((long)((this_00->_value).x + 2) + 0) = 0.0;
  *(float *)((long)((this_00->_value).x + 2) + 4) = 0.0;
  *(undefined8 *)((this_00->_value).x[2] + 2) = 0;
  Attribute::Attribute((Attribute *)this_00);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e5840;
  *(float *)((long)((this_00->_value).x + 0) + 0) = 1.0;
  *(float *)((long)((this_00->_value).x + 0) + 4) = 0.0;
  *(undefined8 *)((this_00->_value).x[0] + 2) = 0;
  pafVar1 = (this_00->_value).x;
  *(float *)((long)(pafVar1 + 1) + 4) = 1.0;
  *(float *)((long)(pafVar1 + 1) + 8) = 0.0;
  *(float *)((long)((this_00->_value).x + 2) + 0) = 0.0;
  *(float *)((long)((this_00->_value).x + 2) + 4) = 0.0;
  (this_00->_value).x[2][2] = 1.0;
  copyValueFrom(this_00,&this->super_Attribute);
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}